

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::pack_A_tile_quantize(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  uint uVar19;
  size_t *psVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  undefined8 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined8 *puVar31;
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [32];
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  float *pfVar40;
  ulong *puVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar80;
  float fVar102;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 in_ZMM8 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar107 [16];
  float fVar106;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 in_ZMM9 [64];
  undefined1 auVar114 [64];
  long local_e8;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  
  iVar18 = cpu_support_x86_avx_vnni_int8();
  if (iVar18 == 0) {
    iVar18 = cpu_support_x86_avx_vnni();
    if (iVar18 == 0) {
      iVar18 = cpu_support_x86_avx2();
      auVar42 = _DAT_006008a0;
      if (iVar18 == 0) {
        iVar18 = A->elempack;
        psVar20 = (size_t *)&A->w;
        if (A->dims == 3) {
          psVar20 = &A->cstep;
        }
        iVar4 = (int)*psVar20;
        puVar25 = (undefined8 *)AT->data;
        uVar36 = 0;
        lVar39 = (long)i;
        lVar28 = (long)iVar4;
        if (7 < max_ii) {
          lVar21 = (long)(iVar4 * 4);
          uVar19 = max_kk & 0xfffffffe;
          local_e8 = (long)(iVar18 * k) * 4 + lVar28 * lVar39 * 4;
          lVar26 = (long)(iVar4 * 6) * 4;
          lVar30 = (long)(iVar4 * 2) * 4;
          lVar37 = (long)(iVar4 * 7) * 4;
          lVar27 = (long)(iVar4 * 5) * 4;
          lVar38 = (long)(iVar4 * 3) * 4;
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar45._16_4_ = 0x80000000;
          auVar45._20_4_ = 0x80000000;
          auVar45._24_4_ = 0x80000000;
          auVar45._28_4_ = 0x80000000;
          auVar49._8_4_ = 0x3f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar49._12_4_ = 0x3f000000;
          auVar49._16_4_ = 0x3f000000;
          auVar49._20_4_ = 0x3f000000;
          auVar49._24_4_ = 0x3f000000;
          auVar49._28_4_ = 0x3f000000;
          auVar50._8_4_ = 0x7f007f;
          auVar50._0_8_ = 0x7f007f007f007f;
          auVar50._12_4_ = 0x7f007f;
          auVar54._8_4_ = 0xff81ff81;
          auVar54._0_8_ = 0xff81ff81ff81ff81;
          auVar54._12_4_ = 0xff81ff81;
          auVar60._8_4_ = 0x7f007f;
          auVar60._0_8_ = 0x7f007f007f007f;
          auVar60._12_4_ = 0x7f007f;
          auVar70._8_4_ = 0xff81ff81;
          auVar70._0_8_ = 0xff81ff81ff81ff81;
          auVar70._12_4_ = 0xff81ff81;
          puVar31 = puVar25;
          uVar35 = 0;
          do {
            puVar25 = (undefined8 *)((long)puVar31 + (long)(max_kk * 4));
            pvVar5 = A->data;
            pauVar33 = (undefined1 (*) [32])
                       ((long)pvVar5 + (long)(iVar18 * k) * 4 + (uVar35 + lVar39) * lVar28 * 4);
            auVar111 = *(undefined1 (*) [32])((long)scales->data + uVar35 * 4 + lVar39 * 4);
            fVar2 = auVar111._0_4_;
            fVar3 = auVar111._4_4_;
            fVar11 = auVar111._8_4_;
            fVar7 = auVar111._12_4_;
            fVar8 = auVar111._16_4_;
            fVar9 = auVar111._20_4_;
            fVar10 = auVar111._24_4_;
            if (iVar18 == 8) {
              uVar22 = 0;
              if (1 < max_kk) {
                iVar34 = 1;
                lVar23 = 0;
                do {
                  pauVar32 = pauVar33;
                  pfVar40 = (float *)((long)pvVar5 + lVar23 * 8 + local_e8);
                  auVar98._0_4_ = fVar2 * *pfVar40;
                  auVar98._4_4_ = fVar3 * pfVar40[1];
                  auVar98._8_4_ = fVar11 * pfVar40[2];
                  auVar98._12_4_ = fVar7 * pfVar40[3];
                  auVar98._16_4_ = fVar8 * pfVar40[4];
                  auVar98._20_4_ = fVar9 * pfVar40[5];
                  auVar98._28_36_ = in_ZMM8._28_36_;
                  auVar98._24_4_ = fVar10 * pfVar40[6];
                  auVar114._0_4_ = fVar2 * pfVar40[8];
                  auVar114._4_4_ = fVar3 * pfVar40[9];
                  auVar114._8_4_ = fVar11 * pfVar40[10];
                  auVar114._12_4_ = fVar7 * pfVar40[0xb];
                  auVar114._16_4_ = fVar8 * pfVar40[0xc];
                  auVar114._20_4_ = fVar9 * pfVar40[0xd];
                  auVar114._28_36_ = in_ZMM9._28_36_;
                  auVar114._24_4_ = fVar10 * pfVar40[0xe];
                  auVar111 = vandps_avx(auVar98._0_32_,auVar45);
                  auVar93 = vandps_avx(auVar114._0_32_,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar93 = vorps_avx(auVar93,auVar49);
                  auVar81._0_4_ = (int)(auVar98._0_4_ + auVar111._0_4_);
                  auVar81._4_4_ = (int)(auVar98._4_4_ + auVar111._4_4_);
                  auVar81._8_4_ = (int)(auVar98._8_4_ + auVar111._8_4_);
                  auVar81._12_4_ = (int)(auVar98._12_4_ + auVar111._12_4_);
                  auVar92._16_4_ = (int)(auVar98._16_4_ + auVar111._16_4_);
                  auVar92._0_16_ = auVar81;
                  auVar92._20_4_ = (int)(auVar98._20_4_ + auVar111._20_4_);
                  auVar92._24_4_ = (int)(auVar98._24_4_ + auVar111._24_4_);
                  auVar92._28_4_ = (int)(in_ZMM8._28_4_ + auVar111._28_4_);
                  auVar107._0_4_ = (int)(auVar114._0_4_ + auVar93._0_4_);
                  auVar107._4_4_ = (int)(auVar114._4_4_ + auVar93._4_4_);
                  auVar107._8_4_ = (int)(auVar114._8_4_ + auVar93._8_4_);
                  auVar107._12_4_ = (int)(auVar114._12_4_ + auVar93._12_4_);
                  auVar111._16_4_ = (int)(auVar114._16_4_ + auVar93._16_4_);
                  auVar111._0_16_ = auVar107;
                  auVar111._20_4_ = (int)(auVar114._20_4_ + auVar93._20_4_);
                  auVar111._24_4_ = (int)(auVar114._24_4_ + auVar93._24_4_);
                  auVar111._28_4_ = (int)(in_ZMM9._28_4_ + auVar93._28_4_);
                  auVar81 = vpackssdw_avx(auVar81,auVar92._16_16_);
                  auVar107 = vpackssdw_avx(auVar107,auVar111._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar50);
                  auVar107 = vpminsw_avx(auVar107,auVar50);
                  auVar81 = vpmaxsw_avx(auVar81,auVar54);
                  auVar107 = vpmaxsw_avx(auVar107,auVar54);
                  in_ZMM9 = ZEXT1664(auVar107);
                  auVar81 = vpacksswb_avx(auVar81,auVar107);
                  auVar81 = vpshufb_avx(auVar81,auVar42);
                  *(long *)((long)puVar31 + lVar23) = auVar81._0_8_;
                  auVar81 = vpshufd_avx(auVar81,0x4e);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *(long *)((long)puVar25 + lVar23) = auVar81._0_8_;
                  lVar23 = lVar23 + 8;
                  iVar34 = iVar34 + 2;
                  pauVar33 = (undefined1 (*) [32])(pfVar40 + 0x10);
                } while (iVar34 < max_kk);
                pauVar33 = pauVar32 + 2;
                puVar31 = (undefined8 *)((long)puVar31 + lVar23);
                puVar25 = (undefined8 *)((long)puVar25 + lVar23);
                uVar22 = uVar19;
              }
              if ((int)uVar22 < max_kk) {
                lVar29 = 0;
                lVar23 = 0;
                do {
                  auVar99._0_4_ = fVar2 * *(float *)*pauVar33;
                  auVar99._4_4_ = fVar3 * *(float *)(*pauVar33 + 4);
                  auVar99._8_4_ = fVar11 * *(float *)(*pauVar33 + 8);
                  auVar99._12_4_ = fVar7 * *(float *)(*pauVar33 + 0xc);
                  auVar99._16_4_ = fVar8 * *(float *)(*pauVar33 + 0x10);
                  auVar99._20_4_ = fVar9 * *(float *)(*pauVar33 + 0x14);
                  auVar99._28_36_ = in_ZMM8._28_36_;
                  auVar99._24_4_ = fVar10 * *(float *)(*pauVar33 + 0x18);
                  auVar111 = vandps_avx(auVar99._0_32_,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar82._0_4_ = (int)(auVar99._0_4_ + auVar111._0_4_);
                  auVar82._4_4_ = (int)(auVar99._4_4_ + auVar111._4_4_);
                  auVar82._8_4_ = (int)(auVar99._8_4_ + auVar111._8_4_);
                  auVar82._12_4_ = (int)(auVar99._12_4_ + auVar111._12_4_);
                  auVar93._16_4_ = (int)(auVar99._16_4_ + auVar111._16_4_);
                  auVar93._0_16_ = auVar82;
                  auVar93._20_4_ = (int)(auVar99._20_4_ + auVar111._20_4_);
                  auVar93._24_4_ = (int)(auVar99._24_4_ + auVar111._24_4_);
                  auVar93._28_4_ = (int)(in_ZMM8._28_4_ + auVar111._28_4_);
                  in_ZMM9 = ZEXT1664(auVar93._16_16_);
                  auVar81 = vpackssdw_avx(auVar82,auVar93._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar60);
                  auVar81 = vpmaxsw_avx(auVar81,auVar70);
                  auVar81 = vpacksswb_avx(auVar81,auVar81);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *(int *)((long)puVar31 + lVar29 * 4) = auVar81._0_4_;
                  *(int *)((long)puVar25 + lVar29 * 4) = auVar81._4_4_;
                  pauVar33 = pauVar33 + 1;
                  lVar23 = lVar23 + -4;
                  lVar29 = lVar29 + 1;
                } while (max_kk - uVar22 != (int)lVar29);
                puVar31 = (undefined8 *)((long)puVar31 - lVar23);
                puVar25 = (undefined8 *)((long)puVar25 - lVar23);
              }
            }
            if (iVar18 == 4) {
              uVar22 = 0;
              if (1 < max_kk) {
                iVar34 = 1;
                do {
                  auVar111 = *pauVar33;
                  auVar81 = *(undefined1 (*) [16])(*pauVar33 + lVar21 * 4);
                  auVar92 = vperm2f128_avx(auVar111,*(undefined1 (*) [32])(*pauVar33 + lVar21 * 4),
                                           0x31);
                  fVar106 = auVar111._0_4_ * fVar2;
                  fVar115 = auVar111._4_4_ * fVar3;
                  auVar12._4_4_ = fVar115;
                  auVar12._0_4_ = fVar106;
                  fVar116 = auVar111._8_4_ * fVar11;
                  auVar12._8_4_ = fVar116;
                  fVar117 = auVar111._12_4_ * fVar7;
                  auVar12._12_4_ = fVar117;
                  fVar118 = auVar81._0_4_ * fVar8;
                  auVar12._16_4_ = fVar118;
                  fVar119 = auVar81._4_4_ * fVar9;
                  auVar12._20_4_ = fVar119;
                  fVar120 = auVar81._8_4_ * fVar10;
                  auVar12._24_4_ = fVar120;
                  auVar12._28_4_ = auVar81._12_4_;
                  fVar80 = auVar92._0_4_ * fVar2;
                  fVar100 = auVar92._4_4_ * fVar3;
                  auVar13._4_4_ = fVar100;
                  auVar13._0_4_ = fVar80;
                  fVar101 = auVar92._8_4_ * fVar11;
                  auVar13._8_4_ = fVar101;
                  fVar102 = auVar92._12_4_ * fVar7;
                  auVar13._12_4_ = fVar102;
                  fVar103 = auVar92._16_4_ * fVar8;
                  auVar13._16_4_ = fVar103;
                  fVar104 = auVar92._20_4_ * fVar9;
                  auVar13._20_4_ = fVar104;
                  fVar105 = auVar92._24_4_ * fVar10;
                  auVar13._24_4_ = fVar105;
                  auVar13._28_4_ = auVar92._28_4_;
                  auVar111 = vandps_avx(auVar12,auVar45);
                  auVar93 = vandps_avx(auVar13,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar93 = vorps_avx(auVar93,auVar49);
                  auVar108._0_4_ = (int)(fVar106 + auVar111._0_4_);
                  auVar108._4_4_ = (int)(fVar115 + auVar111._4_4_);
                  auVar108._8_4_ = (int)(fVar116 + auVar111._8_4_);
                  auVar108._12_4_ = (int)(fVar117 + auVar111._12_4_);
                  auVar112._16_4_ = (int)(fVar118 + auVar111._16_4_);
                  auVar112._0_16_ = auVar108;
                  auVar112._20_4_ = (int)(fVar119 + auVar111._20_4_);
                  auVar112._24_4_ = (int)(fVar120 + auVar111._24_4_);
                  auVar112._28_4_ = (int)(auVar81._12_4_ + auVar111._28_4_);
                  auVar83._0_4_ = (int)(fVar80 + auVar93._0_4_);
                  auVar83._4_4_ = (int)(fVar100 + auVar93._4_4_);
                  auVar83._8_4_ = (int)(fVar101 + auVar93._8_4_);
                  auVar83._12_4_ = (int)(fVar102 + auVar93._12_4_);
                  auVar94._16_4_ = (int)(fVar103 + auVar93._16_4_);
                  auVar94._0_16_ = auVar83;
                  auVar94._20_4_ = (int)(fVar104 + auVar93._20_4_);
                  auVar94._24_4_ = (int)(fVar105 + auVar93._24_4_);
                  auVar94._28_4_ = (int)(auVar92._28_4_ + auVar93._28_4_);
                  auVar81 = vpackssdw_avx(auVar108,auVar112._16_16_);
                  auVar107 = vpackssdw_avx(auVar83,auVar94._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar50);
                  auVar107 = vpminsw_avx(auVar107,auVar50);
                  auVar81 = vpmaxsw_avx(auVar81,auVar54);
                  in_ZMM9 = ZEXT1664(auVar81);
                  auVar107 = vpmaxsw_avx(auVar107,auVar54);
                  auVar81 = vpacksswb_avx(auVar81,auVar107);
                  auVar81 = vpshufb_avx(auVar81,auVar42);
                  *puVar31 = auVar81._0_8_;
                  auVar81 = vpshufd_avx(auVar81,0x4e);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *puVar25 = auVar81._0_8_;
                  puVar31 = puVar31 + 1;
                  puVar25 = puVar25 + 1;
                  pauVar33 = pauVar33 + 1;
                  iVar34 = iVar34 + 2;
                  uVar22 = uVar19;
                } while (iVar34 < max_kk);
              }
              if ((int)uVar22 < max_kk) {
                lVar29 = 0;
                lVar23 = 0;
                do {
                  fVar80 = *(float *)*pauVar33 * fVar2;
                  fVar100 = *(float *)(*pauVar33 + 4) * fVar3;
                  auVar14._4_4_ = fVar100;
                  auVar14._0_4_ = fVar80;
                  fVar101 = *(float *)(*pauVar33 + 8) * fVar11;
                  auVar14._8_4_ = fVar101;
                  fVar102 = *(float *)(*pauVar33 + 0xc) * fVar7;
                  auVar14._12_4_ = fVar102;
                  fVar103 = *(float *)(*pauVar33 + lVar21 * 4 + 0x10) * fVar8;
                  auVar14._16_4_ = fVar103;
                  fVar104 = *(float *)(*pauVar33 + lVar21 * 4 + 0x14) * fVar9;
                  auVar14._20_4_ = fVar104;
                  fVar105 = *(float *)(*pauVar33 + lVar21 * 4 + 0x18) * fVar10;
                  auVar14._24_4_ = fVar105;
                  auVar14._28_4_ = *(float *)(*pauVar33 + lVar21 * 4 + 0x1c);
                  auVar111 = vandps_avx(auVar14,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar84._0_4_ = (int)(fVar80 + auVar111._0_4_);
                  auVar84._4_4_ = (int)(fVar100 + auVar111._4_4_);
                  auVar84._8_4_ = (int)(fVar101 + auVar111._8_4_);
                  auVar84._12_4_ = (int)(fVar102 + auVar111._12_4_);
                  auVar95._16_4_ = (int)(fVar103 + auVar111._16_4_);
                  auVar95._0_16_ = auVar84;
                  auVar95._20_4_ = (int)(fVar104 + auVar111._20_4_);
                  auVar95._24_4_ = (int)(fVar105 + auVar111._24_4_);
                  auVar95._28_4_ =
                       (int)(*(float *)(*pauVar33 + lVar21 * 4 + 0x1c) + auVar111._28_4_);
                  in_ZMM9 = ZEXT1664(auVar95._16_16_);
                  auVar81 = vpackssdw_avx(auVar84,auVar95._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar60);
                  auVar81 = vpmaxsw_avx(auVar81,auVar70);
                  auVar81 = vpacksswb_avx(auVar81,auVar81);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *(int *)((long)puVar31 + lVar29 * 4) = auVar81._0_4_;
                  *(int *)((long)puVar25 + lVar29 * 4) = auVar81._4_4_;
                  pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
                  lVar23 = lVar23 + -4;
                  lVar29 = lVar29 + 1;
                } while (max_kk - uVar22 != (int)lVar29);
                puVar31 = (undefined8 *)((long)puVar31 - lVar23);
                puVar25 = (undefined8 *)((long)puVar25 - lVar23);
              }
            }
            if (iVar18 == 1) {
              uVar22 = 0;
              if (1 < max_kk) {
                iVar34 = 1;
                lVar23 = 0;
                do {
                  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar21 * 4)),
                                          ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar27)),0x10);
                  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar26)),
                                          0x20);
                  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar37)),
                                          0x30);
                  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23)),
                                           ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar28 * 4)),0x10)
                  ;
                  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar30)),
                                           0x20);
                  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar38)),
                                           0x30);
                  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar21 * 4 + 4)),
                                          ZEXT416(*(uint *)(*pauVar33 +
                                                           lVar23 + (long)(iVar4 * 5 + 1) * 4)),0x10
                                         );
                  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar26 + 4)
                                                         ),0x20);
                  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(*pauVar33 +
                                                                   lVar23 + (long)(iVar4 * 7 + 1) *
                                                                            4)),0x30);
                  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23 + 4)),
                                          ZEXT416(*(uint *)(*pauVar33 +
                                                           lVar23 + (long)(iVar4 + 1) * 4)),0x10);
                  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar30 + 4)
                                                         ),0x20);
                  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(*pauVar33 +
                                                                   lVar23 + (long)(iVar4 * 3 + 1) *
                                                                            4)),0x30);
                  fVar80 = auVar107._0_4_ * fVar2;
                  fVar100 = auVar107._4_4_ * fVar3;
                  auVar15._4_4_ = fVar100;
                  auVar15._0_4_ = fVar80;
                  fVar101 = auVar107._8_4_ * fVar11;
                  auVar15._8_4_ = fVar101;
                  fVar102 = auVar107._12_4_ * fVar7;
                  auVar15._12_4_ = fVar102;
                  fVar103 = auVar81._0_4_ * fVar8;
                  auVar15._16_4_ = fVar103;
                  fVar104 = auVar81._4_4_ * fVar9;
                  auVar15._20_4_ = fVar104;
                  fVar105 = auVar81._8_4_ * fVar10;
                  auVar15._24_4_ = fVar105;
                  auVar15._28_4_ = auVar81._12_4_;
                  fVar106 = auVar83._0_4_ * fVar2;
                  fVar115 = auVar83._4_4_ * fVar3;
                  auVar16._4_4_ = fVar115;
                  auVar16._0_4_ = fVar106;
                  fVar116 = auVar83._8_4_ * fVar11;
                  auVar16._8_4_ = fVar116;
                  fVar117 = auVar83._12_4_ * fVar7;
                  auVar16._12_4_ = fVar117;
                  fVar118 = auVar82._0_4_ * fVar8;
                  auVar16._16_4_ = fVar118;
                  fVar119 = auVar82._4_4_ * fVar9;
                  auVar16._20_4_ = fVar119;
                  fVar120 = auVar82._8_4_ * fVar10;
                  auVar16._24_4_ = fVar120;
                  auVar16._28_4_ = auVar82._12_4_;
                  auVar111 = vandps_avx(auVar15,auVar45);
                  auVar93 = vandps_avx(auVar16,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar93 = vorps_avx(auVar93,auVar49);
                  auVar85._0_4_ = (int)(fVar80 + auVar111._0_4_);
                  auVar85._4_4_ = (int)(fVar100 + auVar111._4_4_);
                  auVar85._8_4_ = (int)(fVar101 + auVar111._8_4_);
                  auVar85._12_4_ = (int)(fVar102 + auVar111._12_4_);
                  auVar96._16_4_ = (int)(fVar103 + auVar111._16_4_);
                  auVar96._0_16_ = auVar85;
                  auVar96._20_4_ = (int)(fVar104 + auVar111._20_4_);
                  auVar96._24_4_ = (int)(fVar105 + auVar111._24_4_);
                  auVar96._28_4_ = (int)(auVar81._12_4_ + auVar111._28_4_);
                  auVar109._0_4_ = (int)(fVar106 + auVar93._0_4_);
                  auVar109._4_4_ = (int)(fVar115 + auVar93._4_4_);
                  auVar109._8_4_ = (int)(fVar116 + auVar93._8_4_);
                  auVar109._12_4_ = (int)(fVar117 + auVar93._12_4_);
                  auVar113._16_4_ = (int)(fVar118 + auVar93._16_4_);
                  auVar113._0_16_ = auVar109;
                  auVar113._20_4_ = (int)(fVar119 + auVar93._20_4_);
                  auVar113._24_4_ = (int)(fVar120 + auVar93._24_4_);
                  auVar113._28_4_ = (int)(auVar82._12_4_ + auVar93._28_4_);
                  auVar81 = vpackssdw_avx(auVar85,auVar96._16_16_);
                  auVar107 = vpackssdw_avx(auVar109,auVar113._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar50);
                  auVar107 = vpminsw_avx(auVar107,auVar50);
                  auVar81 = vpmaxsw_avx(auVar81,auVar54);
                  auVar107 = vpmaxsw_avx(auVar107,auVar54);
                  in_ZMM9 = ZEXT1664(auVar107);
                  auVar81 = vpacksswb_avx(auVar81,auVar107);
                  auVar81 = vpshufb_avx(auVar81,auVar42);
                  *(long *)((long)puVar31 + lVar23) = auVar81._0_8_;
                  auVar81 = vpshufd_avx(auVar81,0x4e);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *(long *)((long)puVar25 + lVar23) = auVar81._0_8_;
                  lVar23 = lVar23 + 8;
                  iVar34 = iVar34 + 2;
                } while (iVar34 < max_kk);
                puVar31 = (undefined8 *)((long)puVar31 + lVar23);
                puVar25 = (undefined8 *)((long)puVar25 + lVar23);
                pauVar33 = (undefined1 (*) [32])(*pauVar33 + lVar23);
                uVar22 = uVar19;
              }
              iVar34 = max_kk - uVar22;
              if (iVar34 != 0 && (int)uVar22 <= max_kk) {
                lVar23 = 0;
                do {
                  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar21 * 4)),
                                          ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar27)),0x10);
                  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(*pauVar33 +
                                                                   lVar23 + (long)(iVar4 * 6) * 4)),
                                          0x20);
                  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar37)),
                                          0x30);
                  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar33 + lVar23)),
                                           ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar28 * 4)),0x10)
                  ;
                  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(*pauVar33 +
                                                                     lVar23 + (long)(iVar4 * 2) * 4)
                                                           ),0x20);
                  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(*pauVar33 + lVar23 + lVar38)),
                                           0x30);
                  fVar80 = auVar107._0_4_ * fVar2;
                  fVar100 = auVar107._4_4_ * fVar3;
                  auVar17._4_4_ = fVar100;
                  auVar17._0_4_ = fVar80;
                  fVar101 = auVar107._8_4_ * fVar11;
                  auVar17._8_4_ = fVar101;
                  fVar102 = auVar107._12_4_ * fVar7;
                  auVar17._12_4_ = fVar102;
                  fVar103 = auVar81._0_4_ * fVar8;
                  auVar17._16_4_ = fVar103;
                  fVar104 = auVar81._4_4_ * fVar9;
                  auVar17._20_4_ = fVar104;
                  fVar105 = auVar81._8_4_ * fVar10;
                  auVar17._24_4_ = fVar105;
                  auVar17._28_4_ = auVar81._12_4_;
                  auVar111 = vandps_avx(auVar17,auVar45);
                  auVar111 = vorps_avx(auVar111,auVar49);
                  auVar86._0_4_ = (int)(fVar80 + auVar111._0_4_);
                  auVar86._4_4_ = (int)(fVar100 + auVar111._4_4_);
                  auVar86._8_4_ = (int)(fVar101 + auVar111._8_4_);
                  auVar86._12_4_ = (int)(fVar102 + auVar111._12_4_);
                  auVar97._16_4_ = (int)(fVar103 + auVar111._16_4_);
                  auVar97._0_16_ = auVar86;
                  auVar97._20_4_ = (int)(fVar104 + auVar111._20_4_);
                  auVar97._24_4_ = (int)(fVar105 + auVar111._24_4_);
                  auVar97._28_4_ = (int)(auVar81._12_4_ + auVar111._28_4_);
                  in_ZMM9 = ZEXT1664(auVar97._16_16_);
                  auVar81 = vpackssdw_avx(auVar86,auVar97._16_16_);
                  auVar81 = vpminsw_avx(auVar81,auVar60);
                  auVar81 = vpmaxsw_avx(auVar81,auVar70);
                  auVar81 = vpacksswb_avx(auVar81,auVar81);
                  in_ZMM8 = ZEXT1664(auVar81);
                  *(int *)((long)puVar31 + lVar23) = auVar81._0_4_;
                  *(int *)((long)puVar25 + lVar23) = auVar81._4_4_;
                  lVar23 = lVar23 + 4;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
                puVar25 = (undefined8 *)((long)puVar25 + lVar23);
              }
            }
            uVar36 = uVar35 + 8;
            uVar24 = uVar35 + 0xf;
            local_e8 = local_e8 + lVar28 * 0x20;
            puVar31 = puVar25;
            uVar35 = uVar36;
          } while (uVar24 < (uint)max_ii);
        }
        lVar26 = (long)max_ii;
        if ((int)((uint)uVar36 | 3) < max_ii) {
          pvVar5 = A->data;
          pvVar6 = scales->data;
          lVar30 = (long)(iVar4 * 2) * 4;
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar46._8_4_ = 0x3f000000;
          auVar46._0_8_ = 0x3f0000003f000000;
          auVar46._12_4_ = 0x3f000000;
          auVar51._8_4_ = 0x7f007f;
          auVar51._0_8_ = 0x7f007f007f007f;
          auVar51._12_4_ = 0x7f007f;
          auVar55._8_4_ = 0xff81ff81;
          auVar55._0_8_ = 0xff81ff81ff81ff81;
          auVar55._12_4_ = 0xff81ff81;
          uVar35 = uVar36 & 0xffffffff;
          do {
            pfVar40 = (float *)((long)pvVar5 +
                               (uVar35 + lVar39) * lVar28 * 4 + (long)(iVar18 * k) * 4);
            pfVar1 = (float *)((long)pvVar6 + uVar35 * 4 + lVar39 * 4);
            fVar2 = *pfVar1;
            fVar3 = pfVar1[1];
            fVar11 = pfVar1[2];
            fVar7 = pfVar1[3];
            if (iVar18 == 4) {
              uVar19 = 0;
              if (1 < max_kk) {
                iVar34 = 1;
                do {
                  auVar61._0_4_ = fVar2 * *pfVar40;
                  auVar61._4_4_ = fVar3 * pfVar40[1];
                  auVar61._8_4_ = fVar11 * pfVar40[2];
                  auVar61._12_4_ = fVar7 * pfVar40[3];
                  auVar71._0_4_ = fVar2 * pfVar40[4];
                  auVar71._4_4_ = fVar3 * pfVar40[5];
                  auVar71._8_4_ = fVar11 * pfVar40[6];
                  auVar71._12_4_ = fVar7 * pfVar40[7];
                  auVar70 = vunpcklps_avx(auVar61,auVar71);
                  auVar60 = vunpckhps_avx(auVar61,auVar71);
                  auVar50 = vandps_avx(auVar70,auVar42);
                  auVar54 = vandps_avx(auVar60,auVar42);
                  auVar50 = vorps_avx(auVar50,auVar46);
                  auVar54 = vorps_avx(auVar54,auVar46);
                  auVar72._0_4_ = (int)(auVar70._0_4_ + auVar50._0_4_);
                  auVar72._4_4_ = (int)(auVar70._4_4_ + auVar50._4_4_);
                  auVar72._8_4_ = (int)(auVar70._8_4_ + auVar50._8_4_);
                  auVar72._12_4_ = (int)(auVar70._12_4_ + auVar50._12_4_);
                  auVar62._0_4_ = (int)(auVar54._0_4_ + auVar60._0_4_);
                  auVar62._4_4_ = (int)(auVar54._4_4_ + auVar60._4_4_);
                  auVar62._8_4_ = (int)(auVar54._8_4_ + auVar60._8_4_);
                  auVar62._12_4_ = (int)(auVar54._12_4_ + auVar60._12_4_);
                  auVar50 = vpackssdw_avx(auVar72,auVar62);
                  auVar50 = vpminsw_avx(auVar50,auVar51);
                  auVar50 = vpmaxsw_avx(auVar50,auVar55);
                  auVar50 = vpacksswb_avx(auVar50,auVar50);
                  *puVar25 = auVar50._0_8_;
                  puVar25 = puVar25 + 1;
                  pfVar40 = pfVar40 + 8;
                  iVar34 = iVar34 + 2;
                  uVar19 = max_kk & 0xfffffffeU;
                } while (iVar34 < max_kk);
              }
              iVar34 = max_kk - uVar19;
              if (iVar34 != 0 && (int)uVar19 <= max_kk) {
                do {
                  auVar63._0_4_ = fVar2 * *pfVar40;
                  auVar63._4_4_ = fVar3 * pfVar40[1];
                  auVar63._8_4_ = fVar11 * pfVar40[2];
                  auVar63._12_4_ = fVar7 * pfVar40[3];
                  auVar50 = vandps_avx(auVar63,auVar42);
                  auVar50 = vorps_avx(auVar50,auVar46);
                  auVar64._0_4_ = (int)(auVar63._0_4_ + auVar50._0_4_);
                  auVar64._4_4_ = (int)(auVar63._4_4_ + auVar50._4_4_);
                  auVar64._8_4_ = (int)(auVar63._8_4_ + auVar50._8_4_);
                  auVar64._12_4_ = (int)(auVar63._12_4_ + auVar50._12_4_);
                  auVar50 = vpackssdw_avx(auVar64,auVar64);
                  auVar50 = vpminsw_avx(auVar50,auVar51);
                  auVar50 = vpmaxsw_avx(auVar50,auVar55);
                  auVar50 = vpacksswb_avx(auVar50,auVar50);
                  *(int *)puVar25 = auVar50._0_4_;
                  puVar25 = (undefined8 *)((long)puVar25 + 4);
                  pfVar40 = pfVar40 + 4;
                  iVar34 = iVar34 + -1;
                } while (iVar34 != 0);
              }
            }
            if (iVar18 == 1) {
              uVar19 = 0;
              if (1 < max_kk) {
                iVar34 = 1;
                lVar27 = 0;
                do {
                  auVar50 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar40 + lVar27)),
                                          ZEXT416(*(uint *)((long)pfVar40 + lVar27 + lVar28 * 4)),
                                          0x10);
                  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar40 + lVar27 + lVar30)
                                                         ),0x20);
                  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar40 +
                                                                   lVar27 + (long)(iVar4 * 3) * 4)),
                                          0x30);
                  auVar54 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar40 + lVar27 + 4)),
                                          ZEXT416(*(uint *)((long)pfVar40 +
                                                           lVar27 + (long)(iVar4 + 1) * 4)),0x10);
                  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)pfVar40 +
                                                                   lVar27 + lVar30 + 4)),0x20);
                  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)pfVar40 +
                                                                   lVar27 + (long)(iVar4 * 3 + 1) *
                                                                            4)),0x30);
                  auVar65._0_4_ = auVar50._0_4_ * fVar2;
                  auVar65._4_4_ = auVar50._4_4_ * fVar3;
                  auVar65._8_4_ = auVar50._8_4_ * fVar11;
                  auVar65._12_4_ = auVar50._12_4_ * fVar7;
                  auVar73._0_4_ = auVar54._0_4_ * fVar2;
                  auVar73._4_4_ = auVar54._4_4_ * fVar3;
                  auVar73._8_4_ = auVar54._8_4_ * fVar11;
                  auVar73._12_4_ = auVar54._12_4_ * fVar7;
                  auVar70 = vunpcklps_avx(auVar65,auVar73);
                  auVar60 = vunpckhps_avx(auVar65,auVar73);
                  auVar50 = vandps_avx(auVar70,auVar42);
                  auVar54 = vandps_avx(auVar60,auVar42);
                  auVar50 = vorps_avx(auVar50,auVar46);
                  auVar54 = vorps_avx(auVar54,auVar46);
                  auVar74._0_4_ = (int)(auVar70._0_4_ + auVar50._0_4_);
                  auVar74._4_4_ = (int)(auVar70._4_4_ + auVar50._4_4_);
                  auVar74._8_4_ = (int)(auVar70._8_4_ + auVar50._8_4_);
                  auVar74._12_4_ = (int)(auVar70._12_4_ + auVar50._12_4_);
                  auVar66._0_4_ = (int)(auVar54._0_4_ + auVar60._0_4_);
                  auVar66._4_4_ = (int)(auVar54._4_4_ + auVar60._4_4_);
                  auVar66._8_4_ = (int)(auVar54._8_4_ + auVar60._8_4_);
                  auVar66._12_4_ = (int)(auVar54._12_4_ + auVar60._12_4_);
                  auVar50 = vpackssdw_avx(auVar74,auVar66);
                  auVar50 = vpminsw_avx(auVar50,auVar51);
                  auVar50 = vpmaxsw_avx(auVar50,auVar55);
                  auVar50 = vpacksswb_avx(auVar50,auVar50);
                  *(long *)((long)puVar25 + lVar27) = auVar50._0_8_;
                  lVar27 = lVar27 + 8;
                  iVar34 = iVar34 + 2;
                } while (iVar34 < max_kk);
                puVar25 = (undefined8 *)((long)puVar25 + lVar27);
                pfVar40 = (float *)((long)pfVar40 + lVar27);
                uVar19 = max_kk & 0xfffffffeU;
              }
              if ((int)uVar19 < max_kk) {
                lVar27 = 0;
                do {
                  auVar50 = vinsertps_avx(ZEXT416((uint)pfVar40[lVar27]),
                                          ZEXT416((uint)pfVar40[lVar28 + lVar27]),0x10);
                  auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)pfVar40[iVar4 * 2 + lVar27]),0x20);
                  auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)pfVar40[iVar4 * 3 + lVar27]),0x30);
                  auVar67._0_4_ = auVar50._0_4_ * fVar2;
                  auVar67._4_4_ = auVar50._4_4_ * fVar3;
                  auVar67._8_4_ = auVar50._8_4_ * fVar11;
                  auVar67._12_4_ = auVar50._12_4_ * fVar7;
                  auVar50 = vandps_avx(auVar67,auVar42);
                  auVar50 = vorps_avx(auVar50,auVar46);
                  auVar68._0_4_ = (int)(auVar67._0_4_ + auVar50._0_4_);
                  auVar68._4_4_ = (int)(auVar67._4_4_ + auVar50._4_4_);
                  auVar68._8_4_ = (int)(auVar67._8_4_ + auVar50._8_4_);
                  auVar68._12_4_ = (int)(auVar67._12_4_ + auVar50._12_4_);
                  auVar50 = vpackssdw_avx(auVar68,auVar68);
                  auVar50 = vpminsw_avx(auVar50,auVar51);
                  auVar50 = vpmaxsw_avx(auVar50,auVar55);
                  auVar50 = vpacksswb_avx(auVar50,auVar50);
                  *(int *)puVar25 = auVar50._0_4_;
                  puVar25 = (undefined8 *)((long)puVar25 + 4);
                  lVar27 = lVar27 + 1;
                } while (max_kk - uVar19 != (int)lVar27);
              }
            }
            uVar36 = uVar35 + 4;
            lVar27 = uVar35 + 7;
            uVar35 = uVar36;
          } while (lVar27 < lVar26);
        }
        lVar30 = (long)k;
        if ((int)((uint)uVar36 | 1) < max_ii) {
          lVar27 = (uVar36 & 0xffffffff) + lVar39;
          lVar38 = (lVar27 * 4 + 4) * lVar28 + lVar30 * 4;
          lVar27 = lVar30 * 4 + lVar27 * lVar28 * 4;
          auVar43._8_4_ = 0x80000000;
          auVar43._0_8_ = 0x8000000080000000;
          auVar43._12_4_ = 0x80000000;
          auVar47._8_4_ = 0x3f000000;
          auVar47._0_8_ = 0x3f0000003f000000;
          auVar47._12_4_ = 0x3f000000;
          auVar52._8_4_ = 0x7f007f;
          auVar52._0_8_ = 0x7f007f007f007f;
          auVar52._12_4_ = 0x7f007f;
          auVar56._8_4_ = 0xff81ff81;
          auVar56._0_8_ = 0xff81ff81ff81ff81;
          auVar56._12_4_ = 0xff81ff81;
          auVar58._8_4_ = 0x3effffff;
          auVar58._0_8_ = 0x3effffff3effffff;
          auVar58._12_4_ = 0x3effffff;
          uVar35 = uVar36 & 0xffffffff;
          do {
            lVar21 = uVar35 + lVar39;
            fVar2 = *(float *)((long)scales->data + lVar21 * 4);
            auVar69._4_4_ = fVar2;
            auVar69._0_4_ = fVar2;
            auVar69._8_4_ = fVar2;
            auVar69._12_4_ = fVar2;
            fVar3 = *(float *)((long)scales->data + lVar21 * 4 + 4);
            auVar75._4_4_ = fVar3;
            auVar75._0_4_ = fVar3;
            auVar75._8_4_ = fVar3;
            auVar75._12_4_ = fVar3;
            pvVar5 = A->data;
            puVar41 = (ulong *)((long)pvVar5 + lVar30 * 4 + lVar21 * lVar28 * 4);
            if (max_kk < 4) {
              uVar19 = 0;
            }
            else {
              iVar18 = 3;
              lVar21 = 0;
              do {
                pfVar40 = (float *)((long)pvVar5 + lVar21 * 2 + lVar27);
                auVar78._0_4_ = fVar2 * *pfVar40;
                auVar78._4_4_ = fVar2 * pfVar40[1];
                auVar78._8_4_ = fVar2 * pfVar40[2];
                auVar78._12_4_ = fVar2 * pfVar40[3];
                pfVar40 = (float *)((long)pvVar5 + lVar21 * 2 + lVar38);
                auVar87._0_4_ = fVar3 * *pfVar40;
                auVar87._4_4_ = fVar3 * pfVar40[1];
                auVar87._8_4_ = fVar3 * pfVar40[2];
                auVar87._12_4_ = fVar3 * pfVar40[3];
                auVar54 = vmovlhps_avx(auVar78,auVar87);
                auVar60 = vunpckhpd_avx(auVar78,auVar87);
                auVar42 = vandps_avx(auVar54,auVar43);
                auVar50 = vandps_avx(auVar60,auVar43);
                auVar42 = vorps_avx(auVar42,auVar47);
                auVar50 = vorps_avx(auVar50,auVar47);
                auVar88._0_4_ = (int)(auVar42._0_4_ + auVar54._0_4_);
                auVar88._4_4_ = (int)(auVar42._4_4_ + auVar54._4_4_);
                auVar88._8_4_ = (int)(auVar42._8_4_ + auVar54._8_4_);
                auVar88._12_4_ = (int)(auVar42._12_4_ + auVar54._12_4_);
                auVar79._0_4_ = (int)(auVar50._0_4_ + auVar60._0_4_);
                auVar79._4_4_ = (int)(auVar50._4_4_ + auVar60._4_4_);
                auVar79._8_4_ = (int)(auVar50._8_4_ + auVar60._8_4_);
                auVar79._12_4_ = (int)(auVar50._12_4_ + auVar60._12_4_);
                auVar42 = vpackssdw_avx(auVar88,auVar79);
                auVar42 = vpminsw_avx(auVar42,auVar52);
                auVar42 = vpmaxsw_avx(auVar42,auVar56);
                auVar42 = vpacksswb_avx(auVar42,auVar42);
                *(long *)((long)puVar25 + lVar21) = auVar42._0_8_;
                puVar41 = puVar41 + 2;
                lVar21 = lVar21 + 8;
                iVar18 = iVar18 + 4;
              } while (iVar18 < max_kk);
              puVar25 = (undefined8 *)((long)puVar25 + lVar21);
              uVar19 = max_kk & 0xfffffffc;
            }
            if ((int)(uVar19 | 1) < max_kk) {
              auVar42 = vmovlhps_avx(auVar69,auVar75);
              uVar22 = uVar19;
              do {
                auVar89._8_8_ = 0;
                auVar89._0_8_ = *(ulong *)((long)puVar41 + lVar28 * 4);
                auVar110._8_8_ = 0;
                auVar110._0_8_ = *puVar41;
                auVar50 = vmovlhps_avx(auVar110,auVar89);
                auVar90._0_4_ = auVar50._0_4_ * auVar42._0_4_;
                auVar90._4_4_ = auVar50._4_4_ * auVar42._4_4_;
                auVar90._8_4_ = auVar50._8_4_ * auVar42._8_4_;
                auVar90._12_4_ = auVar50._12_4_ * auVar42._12_4_;
                auVar50 = vandps_avx(auVar90,auVar43);
                auVar50 = vorps_avx(auVar50,auVar47);
                auVar91._0_4_ = (int)(auVar90._0_4_ + auVar50._0_4_);
                auVar91._4_4_ = (int)(auVar90._4_4_ + auVar50._4_4_);
                auVar91._8_4_ = (int)(auVar90._8_4_ + auVar50._8_4_);
                auVar91._12_4_ = (int)(auVar90._12_4_ + auVar50._12_4_);
                auVar50 = vpackssdw_avx(auVar91,auVar91);
                auVar50 = vpminsw_avx(auVar50,auVar52);
                auVar50 = vpmaxsw_avx(auVar50,auVar56);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                *(int *)puVar25 = auVar50._0_4_;
                puVar25 = (undefined8 *)((long)puVar25 + 4);
                puVar41 = puVar41 + 1;
                uVar19 = uVar22 + 2;
                iVar18 = uVar22 + 3;
                uVar22 = uVar19;
              } while (iVar18 < max_kk);
            }
            if ((int)uVar19 < max_kk) {
              lVar21 = 0;
              do {
                fVar11 = fVar2 * *(float *)((long)puVar41 + lVar21 * 4);
                auVar42 = vandps_avx(ZEXT416((uint)fVar11),auVar43);
                auVar42 = vorps_avx(auVar42,auVar58);
                auVar42 = ZEXT416((uint)(auVar42._0_4_ + fVar11));
                auVar42 = vroundss_avx(auVar42,auVar42,0xb);
                iVar18 = (int)auVar42._0_4_;
                if (iVar18 < -0x7e) {
                  iVar18 = -0x7f;
                }
                if (0x7e < iVar18) {
                  iVar18 = 0x7f;
                }
                *(char *)puVar25 = (char)iVar18;
                fVar11 = fVar3 * *(float *)((long)puVar41 + lVar21 * 4 + lVar28 * 4);
                auVar42 = vandps_avx(ZEXT416((uint)fVar11),auVar43);
                auVar42 = vorps_avx(auVar42,auVar58);
                auVar42 = ZEXT416((uint)(auVar42._0_4_ + fVar11));
                auVar42 = vroundss_avx(auVar42,auVar42,0xb);
                iVar18 = (int)auVar42._0_4_;
                if (iVar18 < -0x7e) {
                  iVar18 = -0x7f;
                }
                if (0x7e < iVar18) {
                  iVar18 = 0x7f;
                }
                *(char *)((long)puVar25 + 1) = (char)iVar18;
                puVar25 = (undefined8 *)((long)puVar25 + 2);
                lVar21 = lVar21 + 1;
              } while (max_kk - uVar19 != (int)lVar21);
            }
            uVar36 = uVar35 + 2;
            lVar21 = uVar35 + 3;
            lVar38 = lVar38 + lVar28 * 8;
            lVar27 = lVar27 + lVar28 * 8;
            uVar35 = uVar36;
          } while (lVar21 < lVar26);
        }
        if ((int)uVar36 < max_ii) {
          lVar27 = (long)(int)uVar36;
          auVar44._8_4_ = 0x80000000;
          auVar44._0_8_ = 0x8000000080000000;
          auVar44._12_4_ = 0x80000000;
          auVar48._8_4_ = 0x3f000000;
          auVar48._0_8_ = 0x3f0000003f000000;
          auVar48._12_4_ = 0x3f000000;
          auVar53._8_4_ = 0x7f007f;
          auVar53._0_8_ = 0x7f007f007f007f;
          auVar53._12_4_ = 0x7f007f;
          auVar57._8_4_ = 0xff81ff81;
          auVar57._0_8_ = 0xff81ff81ff81ff81;
          auVar57._12_4_ = 0xff81ff81;
          auVar59._8_4_ = 0x3effffff;
          auVar59._0_8_ = 0x3effffff3effffff;
          auVar59._12_4_ = 0x3effffff;
          do {
            fVar2 = *(float *)((long)scales->data + (lVar27 + lVar39) * 4);
            pfVar40 = (float *)((long)A->data + lVar30 * 4 + (lVar27 + lVar39) * lVar28 * 4);
            if (max_kk < 4) {
              uVar19 = 0;
            }
            else {
              iVar18 = 3;
              do {
                auVar76._0_4_ = fVar2 * *pfVar40;
                auVar76._4_4_ = fVar2 * pfVar40[1];
                auVar76._8_4_ = fVar2 * pfVar40[2];
                auVar76._12_4_ = fVar2 * pfVar40[3];
                auVar42 = vandps_avx(auVar76,auVar44);
                auVar42 = vorps_avx(auVar42,auVar48);
                auVar77._0_4_ = (int)(auVar76._0_4_ + auVar42._0_4_);
                auVar77._4_4_ = (int)(auVar76._4_4_ + auVar42._4_4_);
                auVar77._8_4_ = (int)(auVar76._8_4_ + auVar42._8_4_);
                auVar77._12_4_ = (int)(auVar76._12_4_ + auVar42._12_4_);
                auVar42 = vpackssdw_avx(auVar77,auVar77);
                auVar42 = vpminsw_avx(auVar42,auVar53);
                auVar42 = vpmaxsw_avx(auVar42,auVar57);
                auVar42 = vpacksswb_avx(auVar42,auVar42);
                *(int *)puVar25 = auVar42._0_4_;
                puVar25 = (undefined8 *)((long)puVar25 + 4);
                pfVar40 = pfVar40 + 4;
                iVar18 = iVar18 + 4;
                uVar19 = max_kk & 0xfffffffc;
              } while (iVar18 < max_kk);
            }
            if ((int)uVar19 < max_kk) {
              lVar38 = 0;
              do {
                auVar42 = vandps_avx(ZEXT416((uint)(fVar2 * pfVar40[lVar38])),auVar44);
                auVar42 = vorps_avx(auVar42,auVar59);
                auVar42 = ZEXT416((uint)(fVar2 * pfVar40[lVar38] + auVar42._0_4_));
                auVar42 = vroundss_avx(auVar42,auVar42,0xb);
                iVar18 = (int)auVar42._0_4_;
                if (iVar18 < -0x7e) {
                  iVar18 = -0x7f;
                }
                if (0x7e < iVar18) {
                  iVar18 = 0x7f;
                }
                *(char *)((long)puVar25 + lVar38) = (char)iVar18;
                lVar38 = lVar38 + 1;
              } while (max_kk - uVar19 != (int)lVar38);
              puVar25 = (undefined8 *)((long)puVar25 + lVar38);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != lVar26);
        }
      }
      else {
        pack_A_tile_fp32_to_int8_avx2(A,AT,i,max_ii,k,max_kk,scales);
      }
    }
    else {
      pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
    }
    return;
  }
  pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
  return;
}

Assistant:

static void pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}